

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O0

uint __thiscall cmCTestGIT::GetGitVersion(cmCTestGIT *this)

{
  pointer *this_00;
  bool bVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar2;
  int iVar3;
  uint uVar4;
  undefined8 uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1b8;
  string local_188;
  undefined8 uStack_168;
  uint v [4];
  OutputLogger version_err;
  OneLineParser version_out;
  string version;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78 [32];
  iterator local_58;
  size_type local_50;
  undefined1 local_48 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  git_version;
  string git;
  cmCTestGIT *this_local;
  
  if (this->CurrentGitVersion == 0) {
    this_00 = &git_version.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::__cxx11::string::string
              ((string *)this_00,
               (string *)&(this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool);
    version.field_2._M_local_buf[10] = '\x01';
    std::__cxx11::string::string((string *)&local_98,(string *)this_00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_78,"--version",(allocator<char> *)(version.field_2._M_local_buf + 0xb));
    version.field_2._M_local_buf[10] = '\0';
    local_58 = &local_98;
    local_50 = 2;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)(version.field_2._M_local_buf + 9));
    __l._M_len = local_50;
    __l._M_array = local_58;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_48,__l,
             (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)(version.field_2._M_local_buf + 9));
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(version.field_2._M_local_buf + 9));
    local_1b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_58;
    do {
      local_1b8 = local_1b8 + -1;
      std::__cxx11::string::~string((string *)local_1b8);
    } while (local_1b8 != &local_98);
    std::allocator<char>::~allocator((allocator<char> *)(version.field_2._M_local_buf + 0xb));
    std::__cxx11::string::string((string *)&version_out.Line1);
    OneLineParser::OneLineParser
              ((OneLineParser *)&version_err.super_LineParser.Separator,this,"version-out> ",
               (string *)&version_out.Line1);
    cmProcessTools::OutputLogger::OutputLogger
              ((OutputLogger *)(v + 2),(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
               "version-err> ");
    uStack_168 = 0;
    v[0] = 0;
    v[1] = 0;
    std::__cxx11::string::string((string *)&local_188);
    bVar2 = cmCTestVC::RunChild((cmCTestVC *)this,
                                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_48,(OutputParser *)&version_err.super_LineParser.Separator,
                                (OutputParser *)(v + 2),&local_188,Auto);
    bVar1 = false;
    if (bVar2) {
      uVar5 = std::__cxx11::string::c_str();
      iVar3 = __isoc99_sscanf(uVar5,"git version %u.%u.%u.%u",&uStack_168,(long)&uStack_168 + 4,v,
                              v + 1);
      bVar1 = 2 < iVar3;
    }
    std::__cxx11::string::~string((string *)&local_188);
    if (bVar1) {
      uVar4 = cmCTestGITVersion((uint)uStack_168,uStack_168._4_4_,v[0],v[1]);
      this->CurrentGitVersion = uVar4;
    }
    cmProcessTools::OutputLogger::~OutputLogger((OutputLogger *)(v + 2));
    OneLineParser::~OneLineParser((OneLineParser *)&version_err.super_LineParser.Separator);
    std::__cxx11::string::~string((string *)&version_out.Line1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_48);
    std::__cxx11::string::~string
              ((string *)
               &git_version.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  return this->CurrentGitVersion;
}

Assistant:

unsigned int cmCTestGIT::GetGitVersion()
{
  if (!this->CurrentGitVersion) {
    std::string git = this->CommandLineTool;
    std::vector<std::string> git_version = { git, "--version" };
    std::string version;
    OneLineParser version_out(this, "version-out> ", version);
    OutputLogger version_err(this->Log, "version-err> ");
    unsigned int v[4] = { 0, 0, 0, 0 };
    if (this->RunChild(git_version, &version_out, &version_err) &&
        sscanf(version.c_str(), "git version %u.%u.%u.%u", &v[0], &v[1], &v[2],
               &v[3]) >= 3) {
      this->CurrentGitVersion = cmCTestGITVersion(v[0], v[1], v[2], v[3]);
    }
  }
  return this->CurrentGitVersion;
}